

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O1

void __thiscall Web_Constraint::Constraint_Removed(Web_Constraint *this,Am_Slot *removing_slot)

{
  Am_Web_Create_Proc *pAVar1;
  Input_Port *this_00;
  Am_Web_Data *this_01;
  bool bVar2;
  Output_Port **ppOVar3;
  Output_Port *pOVar4;
  Output_Port *pOVar5;
  
  pOVar5 = this->owner->out_list;
  if (pOVar5 != (Output_Port *)0x0) {
    if ((pOVar5->context).data == removing_slot->data) {
      pOVar4 = (Output_Port *)0x0;
    }
    else {
      do {
        pOVar4 = pOVar5;
        pOVar5 = pOVar4->next;
        if (pOVar5 == (Output_Port *)0x0) {
          return;
        }
      } while ((pOVar5->context).data != removing_slot->data);
    }
    ppOVar3 = &pOVar4->next;
    if (pOVar4 == (Output_Port *)0x0) {
      ppOVar3 = &this->owner->out_list;
    }
    *ppOVar3 = pOVar5->next;
    pOVar5->next = (Output_Port *)0x0;
    Dyn_Memory_Manager::Delete(&Output_Port::memory,pOVar5);
    pAVar1 = this->owner->create_proc;
    if ((pAVar1 != (Am_Web_Create_Proc *)0x0) && (bVar2 = (*pAVar1)(removing_slot), bVar2)) {
      this_00 = this->owner->in_list;
      if (this_00 != (Input_Port *)0x0) {
        Input_Port::Destroy(this_00,&this->super_Am_Constraint);
        this->owner->in_list = (Input_Port *)0x0;
      }
      pOVar5 = this->owner->out_list;
      if (pOVar5 != (Output_Port *)0x0) {
        Output_Port::Destroy(pOVar5,&this->super_Am_Constraint);
        this->owner->out_list = (Output_Port *)0x0;
      }
    }
    this_01 = this->owner;
    if (((this_01->in_list == (Input_Port *)0x0) && (this_01 != (Am_Web_Data *)0x0)) &&
       (this_01->out_list == (Output_Port *)0x0)) {
      Am_Web_Data::~Am_Web_Data(this_01);
      operator_delete(this_01);
      return;
    }
  }
  return;
}

Assistant:

void
Web_Constraint::Constraint_Removed(const Am_Slot &removing_slot)
{
  Output_Port *prev = nullptr;
  Output_Port *curr = owner->out_list;
  while (curr) {
    if (curr->context == removing_slot) {
      if (prev)
        prev->next = curr->next;
      else
        owner->out_list = curr->next;
      curr->next = nullptr;
      delete curr;
      if (owner->create_proc && owner->create_proc(removing_slot)) {
        if (owner->in_list) {
          owner->in_list->Destroy(this);
          owner->in_list = nullptr;
        }
        if (owner->out_list) {
          owner->out_list->Destroy(this);
          owner->out_list = nullptr;
        }
      }
      if (!owner->in_list && !owner->out_list)
        delete owner;
      break;
    }
    prev = curr;
    curr = curr->next;
  }
}